

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<double,1,2>
               (Matrix33<double> *A,double c,double s)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0x18) {
    dVar2 = *(double *)((long)A->x[0] + lVar4 + 8);
    dVar3 = *(double *)((long)A->x[0] + lVar4 + 0x10);
    pdVar1 = (double *)((long)A->x[0] + lVar4 + 8);
    *pdVar1 = dVar2 * c + -dVar3 * s;
    pdVar1[1] = dVar2 * s + dVar3 * c;
  }
  return;
}

Assistant:

void
jacobiRotateRight (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A, const T c, const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j]      = c * tau1 - s * tau2;
        A[i][k]      = s * tau1 + c * tau2;
    }
}